

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR yin_parse_err_msg(lysp_yin_ctx *ctx,void *parent,char **value,lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  yin_subelement subelems [2];
  yin_subelement local_58;
  undefined4 local_40;
  char **local_38;
  undefined2 local_30;
  
  local_58.dest = (void *)0x0;
  local_58.flags = 0;
  local_58._18_6_ = 0;
  local_58.type = LY_STMT_EXTENSION_INSTANCE;
  local_58._4_4_ = 0;
  local_40 = 0x350005;
  local_30 = 7;
  local_38 = value;
  LVar1 = lyxml_ctx_next(ctx->xmlctx);
  if ((LVar1 == LY_SUCCESS) &&
     (LVar1 = yin_parse_attribute(ctx,YIN_ARG_NONE,(char **)0x0,Y_MAYBE_STR_ARG,
                                  LY_STMT_ERROR_MESSAGE), LVar1 == LY_SUCCESS)) {
    LVar1 = yin_parse_content(ctx,&local_58,2,parent,LY_STMT_ERROR_MESSAGE,(char **)0x0,exts);
  }
  return LVar1;
}

Assistant:

static LY_ERR
yin_parse_err_msg(struct lysp_yin_ctx *ctx, const void *parent, const char **value, struct lysp_ext_instance **exts)
{
    struct yin_subelement subelems[] = {
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
        {LY_STMT_ARG_VALUE, value, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE | YIN_SUBELEM_FIRST}
    };

    /* check attributes */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NONE, NULL, Y_MAYBE_STR_ARG, LY_STMT_ERROR_MESSAGE));

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), parent, LY_STMT_ERROR_MESSAGE, NULL, exts));

    return LY_SUCCESS;
}